

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::
DefaultSamplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
::DefaultSamplings(DefaultSamplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
                   *this)

{
  Sampling<tcu::Vector<float,_2>_> *in0_;
  Sampling<tcu::Vector<float,_2>_> *in1_;
  Sampling<tcu::Vector<float,_2>_> *in2_;
  Sampling<vkt::shaderexecutor::Void> *in3_;
  DefaultSamplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  in0_ = &instance<vkt::shaderexecutor::DefaultSampling<tcu::Vector<float,2>>>()->
          super_Sampling<tcu::Vector<float,_2>_>;
  in1_ = &instance<vkt::shaderexecutor::DefaultSampling<tcu::Vector<float,2>>>()->
          super_Sampling<tcu::Vector<float,_2>_>;
  in2_ = &instance<vkt::shaderexecutor::DefaultSampling<tcu::Vector<float,2>>>()->
          super_Sampling<tcu::Vector<float,_2>_>;
  in3_ = &instance<vkt::shaderexecutor::DefaultSampling<vkt::shaderexecutor::Void>>()->
          super_Sampling<vkt::shaderexecutor::Void>;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
  ::Samplings(&this->
               super_Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
              ,in0_,in1_,in2_,in3_);
  return;
}

Assistant:

DefaultSamplings	(void)
		: Samplings<In>(instance<DefaultSampling<typename In::In0> >(),
						instance<DefaultSampling<typename In::In1> >(),
						instance<DefaultSampling<typename In::In2> >(),
						instance<DefaultSampling<typename In::In3> >()) {}